

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O2

void BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,Command *cmds,
               size_t num_commands,ContextType literal_context_mode,MetaBlockSplit *mb)

{
  BrotliDistanceParams *pBVar1;
  BlockSplit *dist_split;
  ulong uVar2;
  BrotliDistanceParams *orig_params_00;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  HistogramLiteral *pHVar7;
  ContextType *context_modes;
  HistogramDistance *pHVar8;
  HistogramCommand *__s;
  size_t sVar9;
  uint32_t *puVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  BrotliEncoderParams *pBVar17;
  BrotliEncoderParams *pBVar18;
  uint16_t *puVar19;
  size_t sVar20;
  uint32_t ndirect;
  HistogramLiteral *literal_histograms;
  HistogramDistance *copy_dist_histograms;
  uint32_t uVar21;
  ulong uVar22;
  bool bVar23;
  double local_188;
  double dist_cost;
  BrotliEncoderParams new_params;
  BrotliEncoderParams orig_params;
  
  lVar13 = 0x10;
  pBVar17 = params;
  pBVar18 = &orig_params;
  for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
    iVar5 = pBVar17->quality;
    pBVar18->mode = pBVar17->mode;
    pBVar18->quality = iVar5;
    pBVar17 = (BrotliEncoderParams *)&pBVar17->lgwin;
    pBVar18 = (BrotliEncoderParams *)&pBVar18->lgwin;
  }
  pBVar17 = params;
  pBVar18 = &new_params;
  for (; uVar4 = orig_params.dist.num_direct_distance_codes,
      uVar3 = orig_params.dist.distance_postfix_bits, lVar13 != 0; lVar13 = lVar13 + -1) {
    iVar5 = pBVar17->quality;
    pBVar18->mode = pBVar17->mode;
    pBVar18->quality = iVar5;
    pBVar17 = (BrotliEncoderParams *)&pBVar17->lgwin;
    pBVar18 = (BrotliEncoderParams *)&pBVar18->lgwin;
  }
  orig_params_00 = &orig_params.dist;
  local_188 = 1e+99;
  pBVar1 = &params->dist;
  bVar23 = true;
  uVar21 = 0;
  uVar6 = 0;
  do {
    if (uVar21 == 4) {
      if ((bVar23) &&
         (ComputeDistanceCost(cmds,num_commands,orig_params_00,orig_params_00,&dist_cost),
         dist_cost < local_188)) {
        (params->dist).max_distance = orig_params.dist.max_distance;
        pBVar1->distance_postfix_bits = orig_params.dist.distance_postfix_bits;
        pBVar1->num_direct_distance_codes = orig_params.dist.num_direct_distance_codes;
        (params->dist).alphabet_size = orig_params.dist.alphabet_size;
        *(undefined4 *)&(params->dist).field_0xc = orig_params.dist._12_4_;
      }
      if ((uVar3 != pBVar1->distance_postfix_bits) ||
         (uVar4 != (params->dist).num_direct_distance_codes)) {
        puVar19 = &cmds->dist_prefix_;
        sVar15 = num_commands;
        while (bVar23 = sVar15 != 0, sVar15 = sVar15 - 1, bVar23) {
          if (((*(uint *)(puVar19 + -5) & 0x1ffffff) != 0) && (0x7f < puVar19[-1])) {
            uVar6 = *puVar19 & 0x3ff;
            if (uVar4 + 0x10 <= uVar6) {
              uVar6 = (uVar6 - uVar4) - 0x10;
              uVar6 = (uVar6 & ~(-1 << ((byte)uVar3 & 0x1f))) + uVar4 + 0x10 +
                      ((((uVar6 >> (uVar3 & 0x1f) & 1) != 0) + 2 << ((byte)(*puVar19 >> 10) & 0x1f))
                       + *(uint32_t *)(puVar19 + -3) + -4 << ((byte)uVar3 & 0x1f));
            }
            uVar22 = (ulong)uVar6;
            uVar16 = (ulong)(params->dist).num_direct_distance_codes;
            uVar2 = uVar16 + 0x10;
            if (uVar22 < uVar2) {
              uVar21 = 0;
            }
            else {
              bVar11 = (byte)pBVar1->distance_postfix_bits;
              uVar16 = ((4L << (bVar11 & 0x3f)) + (uVar22 - uVar16)) - 0x10;
              uVar6 = 0x1f;
              uVar14 = (uint)uVar16;
              if (uVar14 != 0) {
                for (; uVar14 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar6 = (uVar6 ^ 0xffffffe0) + 0x1f;
              bVar23 = (uVar16 >> ((ulong)uVar6 & 0x3f) & 1) != 0;
              iVar5 = uVar6 - pBVar1->distance_postfix_bits;
              uVar22 = (ulong)(((uint)bVar23 + iVar5 * 2 + 0xfffe << (bVar11 & 0x3f)) +
                               (int)uVar2 + (~(-1 << (bVar11 & 0x1f)) & uVar14) | iVar5 * 0x400);
              uVar21 = (uint32_t)
                       (uVar16 - ((ulong)bVar23 + 2 << ((byte)uVar6 & 0x3f)) >> (bVar11 & 0x3f));
            }
            *puVar19 = (ushort)uVar22;
            *(uint32_t *)(puVar19 + -3) = uVar21;
          }
          puVar19 = puVar19 + 8;
        }
      }
      dist_split = &mb->distance_split;
      BrotliSplitBlock(m,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                       &mb->command_split,dist_split);
      sVar15 = (mb->literal_split).num_types;
      if (params->disable_literal_context_modeling == 0) {
        if (sVar15 == 0) {
          sVar15 = 0;
          context_modes = (ContextType *)0x0;
        }
        else {
          context_modes = (ContextType *)BrotliAllocate(m,sVar15 << 2);
          sVar15 = (mb->literal_split).num_types;
        }
        lVar13 = 0x40;
        for (sVar20 = 0; sVar15 != sVar20; sVar20 = sVar20 + 1) {
          context_modes[sVar20] = literal_context_mode;
        }
      }
      else {
        context_modes = (ContextType *)0x0;
        lVar13 = 1;
      }
      sVar15 = sVar15 * lVar13;
      sVar20 = sVar15;
      if (sVar15 == 0) {
        pHVar7 = (HistogramLiteral *)0x0;
        literal_histograms = pHVar7;
      }
      else {
        pHVar7 = (HistogramLiteral *)BrotliAllocate(m,sVar15 * 0x410);
        literal_histograms = pHVar7;
      }
      while (sVar20 != 0) {
        memset(pHVar7,0,0x408);
        pHVar7->bit_cost_ = INFINITY;
        pHVar7 = pHVar7 + 1;
        sVar20 = sVar20 - 1;
      }
      lVar13 = dist_split->num_types * 4;
      if (lVar13 == 0) {
        pHVar8 = (HistogramDistance *)0x0;
        copy_dist_histograms = pHVar8;
      }
      else {
        pHVar8 = (HistogramDistance *)BrotliAllocate(m,dist_split->num_types * 0x2240);
        copy_dist_histograms = pHVar8;
      }
      while (bVar23 = lVar13 != 0, lVar13 = lVar13 + -1, bVar23) {
        memset(pHVar8,0,0x888);
        pHVar8->bit_cost_ = INFINITY;
        pHVar8 = pHVar8 + 1;
      }
      sVar20 = (mb->command_split).num_types;
      mb->command_histograms_size = sVar20;
      if (sVar20 == 0) {
        sVar20 = 0;
        __s = (HistogramCommand *)0x0;
      }
      else {
        __s = (HistogramCommand *)BrotliAllocate(m,sVar20 * 0xb10);
        sVar20 = mb->command_histograms_size;
      }
      mb->command_histograms = __s;
      while (bVar23 = sVar20 != 0, sVar20 = sVar20 - 1, bVar23) {
        memset(__s,0,0xb08);
        __s->bit_cost_ = INFINITY;
        __s = __s + 1;
      }
      BrotliBuildHistogramsWithContext
                (cmds,num_commands,&mb->literal_split,&mb->command_split,dist_split,ringbuffer,pos,
                 mask,prev_byte,prev_byte2,context_modes,literal_histograms,mb->command_histograms,
                 copy_dist_histograms);
      BrotliFree(m,context_modes);
      sVar20 = (mb->literal_split).num_types;
      sVar9 = sVar20 << 6;
      mb->literal_context_map_size = sVar9;
      if (sVar9 == 0) {
        mb->literal_context_map = (uint32_t *)0x0;
        mb->literal_histograms_size = 0;
        puVar10 = (uint32_t *)0x0;
        pHVar7 = (HistogramLiteral *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,sVar20 << 8);
        sVar20 = mb->literal_context_map_size;
        mb->literal_context_map = puVar10;
        mb->literal_histograms_size = sVar20;
        if (sVar20 == 0) {
          pHVar7 = (HistogramLiteral *)0x0;
        }
        else {
          pHVar7 = (HistogramLiteral *)BrotliAllocate(m,sVar20 * 0x410);
          puVar10 = mb->literal_context_map;
        }
      }
      mb->literal_histograms = pHVar7;
      BrotliClusterHistogramsLiteral
                (m,literal_histograms,sVar15,0x100,pHVar7,&mb->literal_histograms_size,puVar10);
      BrotliFree(m,literal_histograms);
      if (params->disable_literal_context_modeling != 0) {
        sVar15 = (mb->literal_split).num_types;
        lVar13 = sVar15 << 8;
        while (bVar23 = sVar15 != 0, sVar15 = sVar15 - 1, bVar23) {
          puVar10 = mb->literal_context_map;
          for (lVar12 = -0x100; lVar12 != 0; lVar12 = lVar12 + 4) {
            *(uint32_t *)((long)puVar10 + lVar12 + lVar13) = puVar10[sVar15];
          }
          lVar13 = lVar13 + -0x100;
        }
      }
      sVar20 = (mb->distance_split).num_types;
      sVar15 = sVar20 * 4;
      mb->distance_context_map_size = sVar15;
      if (sVar15 == 0) {
        mb->distance_context_map = (uint32_t *)0x0;
        mb->distance_histograms_size = 0;
        puVar10 = (uint32_t *)0x0;
        sVar15 = 0;
        pHVar8 = (HistogramDistance *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,sVar20 << 4);
        sVar15 = mb->distance_context_map_size;
        mb->distance_context_map = puVar10;
        mb->distance_histograms_size = sVar15;
        if (sVar15 == 0) {
          sVar15 = 0;
          pHVar8 = (HistogramDistance *)0x0;
        }
        else {
          pHVar8 = (HistogramDistance *)BrotliAllocate(m,sVar15 * 0x890);
          puVar10 = mb->distance_context_map;
          sVar15 = mb->distance_context_map_size;
        }
      }
      mb->distance_histograms = pHVar8;
      BrotliClusterHistogramsDistance
                (m,copy_dist_histograms,sVar15,0x100,pHVar8,&mb->distance_histograms_size,puVar10);
      BrotliFree(m,copy_dist_histograms);
      return;
    }
    uVar14 = uVar6 - 1;
    while (uVar6 = uVar14 + 1, uVar6 < 0x10) {
      ndirect = uVar6 << ((byte)uVar21 & 0x1f);
      BrotliInitDistanceParams(&new_params,uVar21,ndirect);
      if (ndirect == uVar4 && uVar21 == uVar3) {
        bVar23 = false;
      }
      iVar5 = ComputeDistanceCost(cmds,num_commands,orig_params_00,&new_params.dist,&dist_cost);
      if ((iVar5 == 0) || (local_188 < dist_cost)) break;
      (params->dist).max_distance = new_params.dist.max_distance;
      pBVar1->distance_postfix_bits = new_params.dist.distance_postfix_bits;
      pBVar1->num_direct_distance_codes = new_params.dist.num_direct_distance_codes;
      (params->dist).alphabet_size = new_params.dist.alphabet_size;
      *(undefined4 *)&(params->dist).field_0xc = new_params.dist._12_4_;
      uVar14 = uVar6;
      local_188 = dist_cost;
    }
    uVar6 = uVar14 >> 1;
    if (uVar14 == 0xffffffff) {
      uVar6 = 0;
    }
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

void BrotliBuildMetaBlock(MemoryManager* m,
                          const uint8_t* ringbuffer,
                          const size_t pos,
                          const size_t mask,
                          BrotliEncoderParams* params,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          Command* cmds,
                          size_t num_commands,
                          ContextType literal_context_mode,
                          MetaBlockSplit* mb) {
  /* Histogram ids need to fit in one byte. */
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliEncoderParams orig_params = *params;
  BrotliEncoderParams new_params = *params;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect);
      if (npostfix == orig_params.dist.distance_postfix_bits &&
          ndirect == orig_params.dist.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands,
          &orig_params.dist, &new_params.dist, &dist_cost);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params.dist;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands,
                        &orig_params.dist, &orig_params.dist, &dist_cost);
    if (dist_cost < best_dist_cost) {
      best_dist_cost = dist_cost;
      params->dist = orig_params.dist;
    }
  }
  RecomputeDistancePrefixes(cmds, num_commands,
                            &orig_params.dist, &params->dist);

  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split);
  if (BROTLI_IS_OOM(m)) return;

  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }

  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);

  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);

  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);

  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }

  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}